

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O3

type_conflict2
jsoncons::detail::
encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::stream_sink<char>>
          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 last,char *alphabet,stream_sink<char> *result)

{
  byte bVar1;
  undefined5 uVar2;
  byte bVar3;
  char ch;
  undefined8 in_RAX;
  byte bVar4;
  uint uVar5;
  int iVar6;
  long lVar8;
  ulong uVar9;
  type_conflict2 tVar10;
  uchar a3 [3];
  uchar a4 [4];
  undefined8 local_38;
  ulong uVar7;
  
  if (first._M_current == last._M_current) {
    tVar10 = 0;
  }
  else {
    local_38 = CONCAT17(alphabet[0x40],(int7)in_RAX);
    tVar10 = 0;
    uVar9 = 0;
    do {
      uVar5 = (int)uVar9 + 1;
      uVar7 = (ulong)uVar5;
      *(uchar *)((long)&local_38 + uVar9) = *first._M_current;
      uVar9 = local_38;
      if (uVar5 == 3) {
        bVar1 = (byte)local_38;
        bVar3 = local_38._1_1_;
        bVar4 = (byte)local_38 >> 2;
        local_38._0_4_ = CONCAT13(bVar4,(undefined3)local_38);
        local_38._0_5_ = CONCAT14((bVar1 & 3) << 4 | bVar3 >> 4,(undefined4)local_38);
        uVar2 = (undefined5)local_38;
        local_38._2_1_ = SUB81(uVar9,2);
        bVar1 = local_38._2_1_;
        local_38._0_6_ = CONCAT15((bVar3 & 0xf) << 2 | local_38._2_1_ >> 6,uVar2);
        local_38._7_1_ = SUB81(uVar9,7);
        local_38 = CONCAT17(local_38._7_1_,CONCAT16(bVar1,(undefined6)local_38)) &
                   0xff3fffffffffffff;
        lVar8 = 0;
        do {
          stream_sink<char>::push_back(result,alphabet[*(byte *)((long)&local_38 + lVar8 + 3)]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        tVar10 = tVar10 + 4;
        uVar7 = 0;
      }
      first._M_current = first._M_current + 1;
      uVar9 = uVar7;
    } while (first._M_current != last._M_current);
    uVar5 = (uint)uVar7;
    if (0 < (int)uVar5) {
      if (uVar5 < 3) {
        memset((void *)((long)&local_38 + uVar7),0,(ulong)(3 - uVar5));
      }
      uVar9 = local_38;
      bVar1 = (byte)local_38;
      bVar3 = local_38._1_1_;
      bVar4 = (byte)local_38 >> 2;
      local_38._0_4_ = CONCAT13(bVar4,(undefined3)local_38);
      local_38._0_5_ = CONCAT14((bVar1 & 3) << 4 | bVar3 >> 4,(undefined4)local_38);
      uVar2 = (undefined5)local_38;
      local_38._2_1_ = SUB81(uVar9,2);
      local_38._6_2_ = SUB82(uVar9,6);
      local_38._0_6_ = CONCAT15((bVar3 & 0xf) << 2 | local_38._2_1_ >> 6,uVar2);
      uVar9 = 0;
      do {
        stream_sink<char>::push_back(result,alphabet[*(byte *)((long)&local_38 + uVar9 + 3)]);
        uVar9 = uVar9 + 1;
      } while (uVar5 + 1 != uVar9);
      tVar10 = tVar10 + uVar7 + 1;
      ch = local_38._7_1_;
      if (local_38._7_1_ != '\0' && uVar5 < 3) {
        iVar6 = uVar5 - 3;
        do {
          stream_sink<char>::push_back(result,ch);
          tVar10 = tVar10 + 1;
          iVar6 = iVar6 + 1;
        } while (iVar6 != 0);
      }
    }
  }
  return tVar10;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }